

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_section.c
# Opt level: O2

int pt_section_map_share(pt_section *section)

{
  uint16_t uVar1;
  int iVar2;
  
  iVar2 = -1;
  if ((section != (pt_section *)0x0) && (iVar2 = pt_section_lock(section), -1 < iVar2)) {
    if (section->mcount == 0) {
      pt_section_unlock(section);
      iVar2 = -1;
    }
    else {
      uVar1 = section->mcount + 1;
      if (uVar1 != 0) {
        section->mcount = uVar1;
        iVar2 = pt_section_unlock(section);
        return iVar2;
      }
      pt_section_unlock(section);
      iVar2 = -0x19;
    }
  }
  return iVar2;
}

Assistant:

int pt_section_map_share(struct pt_section *section)
{
	uint16_t mcount;
	int errcode;

	if (!section)
		return -pte_internal;

	errcode = pt_section_lock(section);
	if (errcode < 0)
		return errcode;

	mcount = section->mcount;
	if (!mcount) {
		(void) pt_section_unlock(section);
		return -pte_internal;
	}

	mcount += 1;
	if (!mcount) {
		(void) pt_section_unlock(section);
		return -pte_overflow;
	}

	section->mcount = mcount;

	return pt_section_unlock(section);
}